

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O1

FFSFormatList AddUniqueFormats(FFSFormatList List,FFSFormatList Candidates,int copy)

{
  size_t sVar1;
  FFSFormatBlock *pFVar2;
  FFSFormatList pFVar3;
  int iVar4;
  char *pcVar5;
  FFSFormatList pFVar6;
  FFSFormatList pFVar7;
  int iVar8;
  bool bVar9;
  
  pFVar6 = List;
  if (Candidates != (FFSFormatList)0x0) {
    do {
      if (pFVar6 == (FFSFormatList)0x0) {
        bVar9 = true;
        pFVar7 = (FFSFormatList)0x0;
      }
      else {
        sVar1 = Candidates->FormatIDRepLen;
        iVar8 = 0;
        pFVar3 = pFVar6;
        do {
          pFVar7 = pFVar3;
          if (pFVar7->FormatIDRepLen == sVar1) {
            iVar4 = bcmp(pFVar7->FormatIDRep,Candidates->FormatIDRep,pFVar7->FormatIDRepLen);
            iVar8 = iVar8 + (uint)(iVar4 == 0);
          }
          pFVar3 = pFVar7->Next;
        } while (pFVar7->Next != (FFSFormatBlock *)0x0);
        bVar9 = iVar8 == 0;
      }
      pFVar2 = Candidates->Next;
      List = pFVar6;
      if (bVar9) {
        if (copy == 0) {
          Candidates->Next = (FFSFormatBlock *)0x0;
          List = Candidates;
        }
        else {
          List = (FFSFormatList)malloc(0x28);
          List->FormatServerRep = (char *)0x0;
          List->FormatServerRepLen = 0;
          List->FormatIDRep = (char *)0x0;
          List->FormatIDRepLen = 0;
          List->Next = (FFSFormatBlock *)0x0;
          sVar1 = Candidates->FormatServerRepLen;
          pcVar5 = (char *)malloc(sVar1);
          List->FormatServerRep = pcVar5;
          memcpy(pcVar5,Candidates->FormatServerRep,sVar1);
          List->FormatServerRepLen = Candidates->FormatServerRepLen;
          sVar1 = Candidates->FormatIDRepLen;
          pcVar5 = (char *)malloc(sVar1);
          List->FormatIDRep = pcVar5;
          memcpy(pcVar5,Candidates->FormatIDRep,sVar1);
          List->FormatIDRepLen = Candidates->FormatIDRepLen;
        }
        if (pFVar7 != (FFSFormatList)0x0) {
          pFVar7->Next = List;
          List = pFVar6;
        }
      }
      pFVar6 = List;
      Candidates = pFVar2;
    } while (pFVar2 != (FFSFormatBlock *)0x0);
  }
  return List;
}

Assistant:

static FFSFormatList AddUniqueFormats(FFSFormatList List, FFSFormatList Candidates, int copy)
{
    while (Candidates)
    {
        FFSFormatList Last = NULL;
        FFSFormatList Tmp = List;
        int Found = 0;
        FFSFormatList ThisCandidate = Candidates;
        while (Tmp)
        {
            if ((Tmp->FormatIDRepLen == ThisCandidate->FormatIDRepLen) &&
                (memcmp(Tmp->FormatIDRep, ThisCandidate->FormatIDRep, Tmp->FormatIDRepLen) == 0))
            {
                // Identical format already in List, don't add this one
                Found++;
            }
            Last = Tmp;
            Tmp = Tmp->Next;
        }
        Candidates = Candidates->Next;
        if (!Found)
        {
            // New format not in list, add him to tail.
            if (copy)
            {
                // Copy top Candidates entry before return
                FFSFormatList Tmp = malloc(sizeof(*Tmp));
                memset(Tmp, 0, sizeof(*Tmp));
                Tmp->FormatServerRep = malloc(ThisCandidate->FormatServerRepLen);
                memcpy(Tmp->FormatServerRep, ThisCandidate->FormatServerRep,
                       ThisCandidate->FormatServerRepLen);
                Tmp->FormatServerRepLen = ThisCandidate->FormatServerRepLen;
                Tmp->FormatIDRep = malloc(ThisCandidate->FormatIDRepLen);
                memcpy(Tmp->FormatIDRep, ThisCandidate->FormatIDRep, ThisCandidate->FormatIDRepLen);
                Tmp->FormatIDRepLen = ThisCandidate->FormatIDRepLen;
                ThisCandidate = Tmp;
            }
            else
            {
                // disconnect this guy so that he can become list end
                ThisCandidate->Next = NULL;
            }
            if (Last)
            {
                Last->Next = ThisCandidate;
            }
            else
            {
                List = ThisCandidate;
            }
        }
    }
    return List;
}